

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbsdf.c
# Opt level: O1

FT_Error bsdf_raster_render(FT_Raster raster,FT_Raster_Params *params)

{
  FT_Bitmap *target;
  FT_Bitmap *source;
  long lVar1;
  FT_Memory memory;
  SDF_Raster_Params *pSVar2;
  byte bVar3;
  FT_Error error;
  BSDF_Worker worker;
  FT_Error local_a4;
  BSDF_Worker local_a0;
  
  bVar3 = 0;
  local_a4 = 0;
  local_a0.distance_map = (ED *)0x0;
  if (raster == (FT_Raster)0x0 || params == (FT_Raster_Params *)0x0) {
LAB_0024175d:
    local_a4 = 6;
  }
  else if (params->flags == 8) {
    target = params->target;
    source = (FT_Bitmap *)params->source;
    if (source == (FT_Bitmap *)0x0 || target == (FT_Bitmap *)0x0) goto LAB_0024175d;
    memory = *(FT_Memory *)raster;
    if (memory != (FT_Memory)0x0) {
      if (*(int *)&params[1].target - 0x21U < 0xffffffe1) {
        local_a4 = 6;
      }
      else {
        local_a0.distance_map =
             (ED *)ft_mem_qrealloc(memory,(ulong)target->width << 5,0,(ulong)target->rows,
                                   (void *)0x0,&local_a4);
        if (local_a4 == 0) {
          local_a0.width = target->width;
          local_a0.rows = target->rows;
          pSVar2 = &local_a0.params;
          for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
            (pSVar2->root).target = params->target;
            params = (FT_Raster_Params *)((long)params + (ulong)bVar3 * -0x10 + 8);
            pSVar2 = (SDF_Raster_Params *)((long)pSVar2 + ((ulong)bVar3 * -2 + 1) * 8);
          }
          local_a4 = bsdf_init_distance_map(source,&local_a0);
          if (local_a4 == 0) {
            local_a4 = bsdf_approximate_edge(&local_a0);
            if (local_a4 == 0) {
              local_a4 = edt8(&local_a0);
              if (local_a4 == 0) {
                local_a4 = finalize_sdf(&local_a0,target);
              }
            }
          }
        }
      }
      goto LAB_00241771;
    }
    local_a4 = 0x20;
  }
  else {
    local_a4 = 0x61;
  }
  memory = (FT_Memory)0x0;
LAB_00241771:
  if (local_a0.distance_map != (ED *)0x0) {
    ft_mem_free(memory,local_a0.distance_map);
  }
  return local_a4;
}

Assistant:

static FT_Error
  bsdf_raster_render( FT_Raster                raster,
                      const FT_Raster_Params*  params )
  {
    FT_Error   error  = FT_Err_Ok;
    FT_Memory  memory = NULL;

    const FT_Bitmap*  source = NULL;
    const FT_Bitmap*  target = NULL;

    BSDF_TRaster*  bsdf_raster = (BSDF_TRaster*)raster;
    BSDF_Worker    worker;

    const SDF_Raster_Params*  sdf_params = (const SDF_Raster_Params*)params;


    worker.distance_map = NULL;

    /* check for valid parameters */
    if ( !raster || !params )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* check whether the flag is set */
    if ( sdf_params->root.flags != FT_RASTER_FLAG_SDF )
    {
      error = FT_THROW( Raster_Corrupted );
      goto Exit;
    }

    source = (const FT_Bitmap*)sdf_params->root.source;
    target = (const FT_Bitmap*)sdf_params->root.target;

    /* check source and target bitmap */
    if ( !source || !target )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    memory = bsdf_raster->memory;
    if ( !memory )
    {
      FT_TRACE0(( "bsdf_raster_render: Raster not set up properly,\n" ));
      FT_TRACE0(( "                    unable to find memory handle.\n" ));

      error = FT_THROW( Invalid_Handle );
      goto Exit;
    }

    /* check whether spread is set properly */
    if ( sdf_params->spread > MAX_SPREAD ||
         sdf_params->spread < MIN_SPREAD )
    {
      FT_TRACE0(( "bsdf_raster_render:"
                  " The `spread' field of `SDF_Raster_Params'\n" ));
      FT_TRACE0(( "                   "
                  " is invalid; the value of this field must be\n" ));
      FT_TRACE0(( "                   "
                  " within [%d, %d].\n",
                  MIN_SPREAD, MAX_SPREAD ));
      FT_TRACE0(( "                   "
                  " Also, you must pass `SDF_Raster_Params'\n" ));
      FT_TRACE0(( "                   "
                  " instead of the default `FT_Raster_Params'\n" ));
      FT_TRACE0(( "                   "
                  " while calling this function and set the fields\n" ));
      FT_TRACE0(( "                   "
                  " accordingly.\n" ));

      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* set up the worker */

    /* allocate the distance map */
    if ( FT_QALLOC_MULT( worker.distance_map, target->rows,
                         target->width * sizeof ( *worker.distance_map ) ) )
      goto Exit;

    worker.width  = (int)target->width;
    worker.rows   = (int)target->rows;
    worker.params = *sdf_params;

    FT_CALL( bsdf_init_distance_map( source, &worker ) );
    FT_CALL( bsdf_approximate_edge( &worker ) );
    FT_CALL( edt8( &worker ) );
    FT_CALL( finalize_sdf( &worker, target ) );

    FT_TRACE0(( "bsdf_raster_render: Total memory used = %ld\n",
                worker.width * worker.rows *
                  (long)sizeof ( *worker.distance_map ) ));

  Exit:
    if ( worker.distance_map )
      FT_FREE( worker.distance_map );

    return error;
  }